

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O1

int Cut_CutProcessTwo(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1,Cut_List_t *pSuperList)

{
  uint uVar1;
  uint uVar2;
  Cut_Params_t *pCVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  Cut_Cut_t *pCVar6;
  ulong uVar7;
  uint uVar8;
  Cut_Cut_t *pCut0_00;
  
  pCVar6 = pCut1;
  pCut0_00 = pCut0;
  if (*(uint *)pCut0 >> 0x1c < *(uint *)pCut1 >> 0x1c) {
    pCVar6 = pCut0;
    pCut0_00 = pCut1;
  }
  pCVar6 = Cut_CutMergeTwo(p,pCut0_00,pCVar6);
  uVar8 = 0;
  if (pCVar6 != (Cut_Cut_t *)0x0) {
    pCVar3 = p->pParams;
    if ((pCVar3->fSeq == 0) && (*(uint *)pCVar6 < 0x20000000)) {
      __assert_fail("p->pParams->fSeq || pCut->nLeaves > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                    ,0x142,
                    "int Cut_CutProcessTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *, Cut_List_t *)");
    }
    pCVar6->uSign = pCut1->uSign | pCut0->uSign;
    if (pCVar3->fRecord != 0) {
      uVar1 = *(uint *)pCut0;
      uVar2 = *(uint *)pCVar6;
      *(uint *)pCVar6 = uVar2 & 0xfffff800 | uVar1 & 0x7ff;
      *(uint *)pCVar6 = uVar2 & 0xffc00000 | uVar1 & 0x7ff | (*(uint *)pCut1 & 0x7ff) << 0xb;
    }
    if ((p->pParams->fFilter == 0) ||
       ((iVar5 = Cut_CutFilterOne(p,pSuperList,pCVar6), iVar5 == 0 &&
        ((p->pParams->fSeq == 0 ||
         (((p->pCompareOld == (Cut_Cut_t *)0x0 ||
           (iVar5 = Cut_CutFilterOld(p,p->pCompareOld,pCVar6), iVar5 == 0)) &&
          ((p->pCompareNew == (Cut_Cut_t *)0x0 ||
           (iVar5 = Cut_CutFilterOld(p,p->pCompareNew,pCVar6), uVar8 = 0, iVar5 == 0)))))))))) {
      if (p->pParams->fGlobal != 0) {
        pVVar4 = p->vNodeAttrs;
        if (pVVar4 == (Vec_Int_t *)0x0) {
          __assert_fail("p->vNodeAttrs != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                        ,0x158,
                        "int Cut_CutProcessTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *, Cut_List_t *)"
                       );
        }
        uVar8 = *(uint *)pCVar6;
        if ((uVar8 & 0xf0000000) != 0x10000000) {
          if (0xfffffff < uVar8) {
            uVar7 = 0;
            do {
              iVar5 = *(int *)(&pCVar6[1].field_0x0 + uVar7 * 4);
              if (((long)iVar5 < 0) || (pVVar4->nSize <= iVar5)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if (pVVar4->pArray[iVar5] != 0) goto LAB_004af9c1;
              uVar7 = uVar7 + 1;
            } while (uVar8 >> 0x1c != uVar7);
          }
          p->nCutsFilter = p->nCutsFilter + 1;
          Cut_CutRecycle(p,pCVar6);
          return 0;
        }
      }
LAB_004af9c1:
      if (p->pParams->fTruth != 0) {
        Cut_TruthCompute(p,pCVar6,pCut0,pCut1,p->fCompl0,p->fCompl1);
      }
      if (0xbfffffff < *(uint *)pCVar6 + 0xf0000000) {
        __assert_fail("pCut->nLeaves > 0 && pCut->nLeaves <= CUT_SIZE_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutList.h"
                      ,0x59,"void Cut_ListAdd(Cut_List_t *, Cut_Cut_t *)");
      }
      *pSuperList->ppTail[*(uint *)pCVar6 >> 0x1c] = pCVar6;
      pSuperList->ppTail[*(uint *)pCVar6 >> 0x1c] = &pCVar6->pNext;
      iVar5 = p->nNodeCuts + 1;
      p->nNodeCuts = iVar5;
      uVar8 = (uint)(iVar5 == p->pParams->nKeepMax);
    }
  }
  return uVar8;
}

Assistant:

static inline int Cut_CutProcessTwo( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1, Cut_List_t * pSuperList )
{
    Cut_Cut_t * pCut;
    // merge the cuts
    if ( pCut0->nLeaves >= pCut1->nLeaves )
        pCut = Cut_CutMergeTwo( p, pCut0, pCut1 );
    else
        pCut = Cut_CutMergeTwo( p, pCut1, pCut0 );
    if ( pCut == NULL )
        return 0;
    assert( p->pParams->fSeq || pCut->nLeaves > 1 );
    // set the signature
    pCut->uSign = pCut0->uSign | pCut1->uSign;
    if ( p->pParams->fRecord )
        pCut->Num0 = pCut0->Num0, pCut->Num1 = pCut1->Num0;
    // check containment
    if ( p->pParams->fFilter )
    {
        if ( Cut_CutFilterOne(p, pSuperList, pCut) )
//        if ( Cut_CutFilterOneEqual(p, pSuperList, pCut) )
            return 0;
        if ( p->pParams->fSeq )
        {
            if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                return 0;
            if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                return 0;
        }
    }

    if ( p->pParams->fGlobal )
    {
        assert( p->vNodeAttrs != NULL );
        if ( Cut_CutFilterGlobal( p, pCut ) )
            return 0;
    }

    // compute the truth table
    if ( p->pParams->fTruth )
        Cut_TruthCompute( p, pCut, pCut0, pCut1, p->fCompl0, p->fCompl1 );
    // add to the list
    Cut_ListAdd( pSuperList, pCut );
    // return status (0 if okay; 1 if exceeded the limit)
    return ++p->nNodeCuts == p->pParams->nKeepMax;
}